

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execNEST.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* GetBand(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,vector<double,_std::allocator<double>_> *S1s,
         vector<double,_std::allocator<double>_> *S2s,bool resol,int nFold)

{
  uint64_t uVar1;
  ostream *this;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference this_00;
  vector<double,_std::allocator<double>_> *pvVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_2020;
  const_iterator local_2018;
  value_type local_2010;
  double local_2008;
  value_type local_2000;
  double local_1ff8;
  value_type local_1ff0;
  double local_1fe8;
  double local_1fe0;
  double ReqS1;
  uint64_t reject [1000];
  double local_90;
  double numPts;
  double s1c;
  int j;
  int i;
  double border;
  double binWidth;
  allocator<double> local_51;
  value_type local_50;
  vector<double,_std::allocator<double>_> local_48;
  undefined1 local_29;
  int local_28;
  byte local_21;
  int nFold_local;
  bool resol_local;
  vector<double,_std::allocator<double>_> *S2s_local;
  vector<double,_std::allocator<double>_> *S1s_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *signals;
  
  local_28 = nFold;
  local_21 = resol;
  _nFold_local = S2s;
  S2s_local = S1s;
  S1s_local = (vector<double,_std::allocator<double>_> *)__return_storage_ptr__;
  if (1000 < numBins) {
    if (0 < verbosity) {
      this = std::operator<<((ostream *)&std::cerr,
                             "ERROR: Too many bins. Decrease numBins (analysis.hh) or increase NUMBINS_MAX (TestSpectra.hh)"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    exit(1);
  }
  local_29 = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__);
  sVar2 = (size_type)numBins;
  local_50 = -999.0;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,1,&local_50,&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(__return_storage_ptr__,sVar2,&local_48);
  std::vector<double,_std::allocator<double>_>::~vector(&local_48);
  std::allocator<double>::~allocator(&local_51);
  if (useS2 == 2) {
    border = (maxS2 - minS2) / (double)numBins;
    _j = minS2;
  }
  else {
    border = (maxS1 - minS1) / (double)numBins;
    _j = minS1;
  }
  memset(&ReqS1,0,8000);
  if ((local_21 & 1) != 0) {
    numBins = 1;
    border = 1.79769313486232e+308;
  }
  local_1fe0 = 0.0;
  if (local_28 == 0) {
    local_1fe0 = -1.79769313486232e+308;
  }
  s1c._4_4_ = 0;
  do {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(S1s);
    if (sVar2 <= (ulong)(long)s1c._4_4_) {
      for (s1c._0_4_ = 0; s1c._0_4_ < numBins; s1c._0_4_ = s1c._0_4_ + 1) {
        if ((band[s1c._0_4_][0] <= 0.0) && ((local_21 & 1) == 0)) {
          band[s1c._0_4_][0] = (double)s1c._0_4_ * border + _j + border / 2.0;
        }
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
        local_2020._M_current =
             (double *)std::vector<double,_std::allocator<double>_>::begin(this_00);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_2018,&local_2020);
        std::vector<double,_std::allocator<double>_>::erase(pvVar4,local_2018);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
        sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        auVar8._8_4_ = (int)(sVar2 >> 0x20);
        auVar8._0_8_ = sVar2;
        auVar8._12_4_ = 0x45300000;
        local_90 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
        if ((local_90 <= 0.0) && ((local_21 & 1) != 0)) {
          for (s1c._4_4_ = 0; sVar2 = std::vector<double,_std::allocator<double>_>::size(S1s),
              (ulong)(long)s1c._4_4_ < sVar2; s1c._4_4_ = s1c._4_4_ + 1) {
            pvVar5 = S1s;
            std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
            std::abs((int)pvVar5);
            band[s1c._0_4_][0] = extraout_XMM0_Qa_01 + band[s1c._0_4_][0];
          }
          sVar2 = std::vector<double,_std::allocator<double>_>::size(S1s);
          auVar9._8_4_ = (int)(sVar2 >> 0x20);
          auVar9._0_8_ = sVar2;
          auVar9._12_4_ = 0x45300000;
          local_90 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
        }
        if ((local_21 & 1) != 0) {
          band[s1c._0_4_][0] = band[s1c._0_4_][0] / local_90;
        }
        band[s1c._0_4_][1] = band[s1c._0_4_][1] / local_90;
        band[s1c._0_4_][2] = band[s1c._0_4_][2] / local_90;
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
        sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        auVar11._8_4_ = (int)(sVar2 >> 0x20);
        auVar11._0_8_ = sVar2;
        auVar11._12_4_ = 0x45300000;
        if ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) < local_90) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
          sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
          auVar10._8_4_ = (int)(sVar2 >> 0x20);
          auVar10._0_8_ = sVar2;
          auVar10._12_4_ = 0x45300000;
          local_90 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
        }
        for (s1c._4_4_ = 0; s1c._4_4_ < (int)local_90; s1c._4_4_ = s1c._4_4_ + 1) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)s1c._4_4_);
          if ((*pvVar3 != -999.0) || (NAN(*pvVar3))) {
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar4,(long)s1c._4_4_);
            dVar6 = pow(*pvVar3 - band[s1c._0_4_][2],2.0);
            band[s1c._0_4_][3] = dVar6 + band[s1c._0_4_][3];
          }
        }
        for (s1c._4_4_ = 0; sVar2 = std::vector<double,_std::allocator<double>_>::size(S1s),
            (ulong)(long)s1c._4_4_ < sVar2; s1c._4_4_ = s1c._4_4_ + 1) {
          if ((((local_21 & 1) != 0) &&
              (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (S1s,(long)s1c._4_4_), local_1fe0 < *pvVar3)) &&
             (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S2s,(long)s1c._4_4_)
             , 0.0 < *pvVar3)) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
            dVar6 = pow(*pvVar3 - band[s1c._0_4_][0],2.0);
            band[s1c._0_4_][1] = dVar6 + band[s1c._0_4_][1];
          }
        }
        band[s1c._0_4_][3] = band[s1c._0_4_][3] / (local_90 - 1.0);
        dVar6 = sqrt(band[s1c._0_4_][3]);
        band[s1c._0_4_][3] = dVar6;
        if ((local_21 & 1) != 0) {
          band[s1c._0_4_][1] = band[s1c._0_4_][1] / (local_90 - 1.0);
          dVar6 = sqrt(band[s1c._0_4_][1]);
          band[s1c._0_4_][1] = dVar6;
        }
        dVar6 = band[s1c._0_4_][3];
        dVar7 = sqrt(local_90);
        band[s1c._0_4_][4] = dVar6 / dVar7;
        uVar1 = reject[(long)s1c._0_4_ + -1];
        auVar12._8_4_ = (int)(uVar1 >> 0x20);
        auVar12._0_8_ = uVar1;
        auVar12._12_4_ = 0x45300000;
        band[s1c._0_4_][5] =
             local_90 /
             (local_90 +
             (auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        for (s1c._4_4_ = 0; s1c._4_4_ < (int)local_90; s1c._4_4_ = s1c._4_4_ + 1) {
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)s1c._4_4_);
          if ((*pvVar3 != -999.0) || (NAN(*pvVar3))) {
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar4,(long)s1c._4_4_);
            dVar6 = pow((*pvVar3 - band[s1c._0_4_][2]) / band[s1c._0_4_][3],3.0);
            band[s1c._0_4_][6] = dVar6 + band[s1c._0_4_][6];
          }
        }
        band[s1c._0_4_][6] = band[s1c._0_4_][6] / (local_90 - 2.0);
      }
      return __return_storage_ptr__;
    }
    for (s1c._0_4_ = 0; s1c._0_4_ < numBins; s1c._0_4_ = s1c._0_4_ + 1) {
      dVar6 = (double)s1c._0_4_ * border + _j + border / 2.0;
      if ((s1c._4_4_ == 0) && ((local_21 & 1) == 0)) {
        band[s1c._0_4_][0] = dVar6;
      }
      pvVar5 = S1s;
      std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
      std::abs((int)pvVar5);
      if (dVar6 - border / 2.0 < extraout_XMM0_Qa) {
        pvVar5 = S1s;
        std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
        std::abs((int)pvVar5);
        if (dVar6 + border / 2.0 < extraout_XMM0_Qa_00) goto LAB_0010dd50;
LAB_0010dd5a:
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
        if ((*pvVar3 < local_1fe0) ||
           (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S2s,(long)s1c._4_4_),
           *pvVar3 < 0.0)) {
          reject[(long)s1c._0_4_ + -1] = reject[(long)s1c._0_4_ + -1] + 1;
        }
        else {
          if ((local_21 & 1) == 0) {
            if (useS2 == 0) {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_)
              ;
              if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (S2s,(long)s1c._4_4_);
                if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (S2s,(long)s1c._4_4_);
                  dVar6 = *pvVar3;
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (S1s,(long)s1c._4_4_);
                  dVar6 = log10(dVar6 / *pvVar3);
                  if (logMin < dVar6) {
                    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (S2s,(long)s1c._4_4_);
                    dVar6 = *pvVar3;
                    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (S1s,(long)s1c._4_4_);
                    dVar6 = log10(dVar6 / *pvVar3);
                    if (dVar6 < logMax) {
                      pvVar4 = std::
                               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
                      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (S2s,(long)s1c._4_4_);
                      dVar6 = *pvVar3;
                      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (S1s,(long)s1c._4_4_);
                      local_1fe8 = log10(dVar6 / *pvVar3);
                      std::vector<double,_std::allocator<double>_>::push_back(pvVar4,&local_1fe8);
                      goto LAB_0010e239;
                    }
                  }
                }
              }
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
              local_1ff0 = 0.0;
              std::vector<double,_std::allocator<double>_>::push_back(pvVar4,&local_1ff0);
            }
            else if (useS2 == 1) {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_)
              ;
              if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (S2s,(long)s1c._4_4_);
                if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (S2s,(long)s1c._4_4_);
                  dVar6 = log10(*pvVar3);
                  if (logMin < dVar6) {
                    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (S2s,(long)s1c._4_4_);
                    dVar6 = log10(*pvVar3);
                    if (dVar6 < logMax) {
                      pvVar4 = std::
                               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
                      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (S2s,(long)s1c._4_4_);
                      local_1ff8 = log10(*pvVar3);
                      std::vector<double,_std::allocator<double>_>::push_back(pvVar4,&local_1ff8);
                      goto LAB_0010e239;
                    }
                  }
                }
              }
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
              local_2000 = 0.0;
              std::vector<double,_std::allocator<double>_>::push_back(pvVar4,&local_2000);
            }
            else {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_)
              ;
              if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (S2s,(long)s1c._4_4_);
                if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (S1s,(long)s1c._4_4_);
                  dVar6 = *pvVar3;
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (S2s,(long)s1c._4_4_);
                  dVar6 = log10(dVar6 / *pvVar3);
                  if (logMin < dVar6) {
                    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (S1s,(long)s1c._4_4_);
                    dVar6 = *pvVar3;
                    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (S2s,(long)s1c._4_4_);
                    dVar6 = log10(dVar6 / *pvVar3);
                    if (dVar6 < logMax) {
                      pvVar4 = std::
                               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
                      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (S1s,(long)s1c._4_4_);
                      dVar6 = *pvVar3;
                      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (S2s,(long)s1c._4_4_);
                      local_2008 = log10(dVar6 / *pvVar3);
                      std::vector<double,_std::allocator<double>_>::push_back(pvVar4,&local_2008);
                      goto LAB_0010e239;
                    }
                  }
                }
              }
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
              local_2010 = 0.0;
              std::vector<double,_std::allocator<double>_>::push_back(pvVar4,&local_2010);
            }
          }
          else {
            pvVar4 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S2s,(long)s1c._4_4_);
            std::vector<double,_std::allocator<double>_>::push_back(pvVar4,pvVar3);
          }
LAB_0010e239:
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](__return_storage_ptr__,(long)s1c._0_4_);
          pvVar3 = std::vector<double,_std::allocator<double>_>::back(pvVar4);
          band[s1c._0_4_][2] = *pvVar3 + band[s1c._0_4_][2];
          if ((local_21 & 1) == 0) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
            band[s1c._0_4_][1] = *pvVar3 + band[s1c._0_4_][1];
          }
          else {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](S1s,(long)s1c._4_4_);
            band[s1c._0_4_][0] = *pvVar3 + band[s1c._0_4_][0];
          }
        }
        break;
      }
LAB_0010dd50:
      if (local_28 == 0) goto LAB_0010dd5a;
    }
    s1c._4_4_ = s1c._4_4_ + 1;
  } while( true );
}

Assistant:

vector<vector<double>> GetBand(vector<double> S1s, vector<double> S2s,
                               bool resol, int nFold) {
  if (numBins > NUMBINS_MAX) {
    if (verbosity > 0)
      cerr << "ERROR: Too many bins. Decrease numBins (analysis.hh) or "
              "increase NUMBINS_MAX (TestSpectra.hh)"
           << endl;
    exit(EXIT_FAILURE);
  }

  vector<vector<double>> signals;
  signals.resize(numBins, vector<double>(1, -999.));
  double binWidth, border;
  if (useS2 == 2) {
    binWidth = (maxS2 - minS2) / double(numBins);
    border = minS2;
  } else {
    binWidth = (maxS1 - minS1) / double(numBins);
    border = minS1;
  }
  int i = 0, j = 0;
  double s1c, numPts;
  uint64_t reject[NUMBINS_MAX] = {0};

  if (resol) {
    numBins = 1;
    binWidth = DBL_MAX;
  }

  double ReqS1 = 0.;
  if (nFold == 0) ReqS1 = -DBL_MAX;
  for (i = 0; i < S1s.size(); ++i) {
    for (j = 0; j < numBins; ++j) {
      s1c = border + binWidth / 2. + double(j) * binWidth;
      if (i == 0 && !resol) band[j][0] = s1c;
      if ((std::abs(S1s[i]) > (s1c - binWidth / 2.) &&
           std::abs(S1s[i]) <= (s1c + binWidth / 2.)) ||
          !nFold) {
        if (S1s[i] >= ReqS1 && S2s[i] >= 0.) {
          if (resol) {
            signals[j].push_back(S2s[i]);
          } else {
            if (useS2 == 0) {
              if (S1s[i] && S2s[i] && log10(S2s[i] / S1s[i]) > logMin &&
                  log10(S2s[i] / S1s[i]) < logMax)
                signals[j].push_back(log10(S2s[i] / S1s[i]));
              else
                signals[j].push_back(0.);
            } else if (useS2 == 1) {
              if (S1s[i] && S2s[i] && log10(S2s[i]) > logMin &&
                  log10(S2s[i]) < logMax)
                signals[j].push_back(log10(S2s[i]));
              else
                signals[j].push_back(0.);
            } else {
              if (S1s[i] && S2s[i] && log10(S1s[i] / S2s[i]) > logMin &&
                  log10(S1s[i] / S2s[i]) < logMax)
                signals[j].push_back(log10(S1s[i] / S2s[i]));
              else
                signals[j].push_back(0.);
            }
          }
          band[j][2] += signals[j].back();
          if (resol)
            band[j][0] += S1s[i];
          else
            band[j][1] += S1s[i];
        } else
          ++reject[j];
        break;
      }
    }
  }

  for (j = 0; j < numBins; ++j) {
    if (band[j][0] <= 0. && !resol)
      band[j][0] = border + binWidth / 2. + double(j) * binWidth;
    signals[j].erase(signals[j].begin());
    numPts = (double)signals[j].size();
    if (numPts <= 0 && resol) {
      for (i = 0; i < S1s.size(); ++i) band[j][0] += std::abs(S1s[i]);
      numPts = S1s.size();
    }
    if (resol) band[j][0] /= numPts;
    band[j][1] /= numPts;
    band[j][2] /= numPts;
    if (numPts > signals[j].size())
      numPts = signals[j].size();  // seg fault prevention line
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][3] += pow(signals[j][i] - band[j][2], 2.);  // std dev calc
    }
    for (i = 0; i < S1s.size(); ++i) {
      if (resol && S1s[i] > ReqS1 && S2s[i] > 0.0)
        band[j][1] += pow(S1s[i] - band[j][0], 2.);  // std dev calc
    }
    band[j][3] /= numPts - 1.;
    band[j][3] = sqrt(band[j][3]);
    if (resol) {
      band[j][1] /= numPts - 1.;
      band[j][1] = sqrt(band[j][1]);
    }
    band[j][4] = band[j][3] / sqrt(numPts);
    band[j][5] = numPts / (numPts + double(reject[j]));
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][6] +=
            pow((signals[j][i] - band[j][2]) / band[j][3], 3.);  // skew calc
    }
    band[j][6] /= (numPts - 2.);
  }

  return signals;
}